

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O2

void Kit_TruthCountOnesInCofs0(uint *pTruth,int nVars,int *pStore)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  
  bVar1 = (char)nVars - 5U & 0x1f;
  uVar5 = 1 << bVar1;
  iVar7 = (int)uVar5 / 2;
  uVar4 = 0;
  memset(pStore,0,(long)nVars * 4);
  if (nVars < 6) {
    if (0 < nVars) {
      iVar7 = Kit_WordCountOnes(*pTruth & 0x55555555);
      *pStore = iVar7;
      if (nVars != 1) {
        iVar7 = Kit_WordCountOnes(*pTruth & 0x33333333);
        pStore[1] = iVar7;
        if (2 < (uint)nVars) {
          iVar7 = Kit_WordCountOnes(*pTruth & 0xf0f0f0f);
          pStore[2] = iVar7;
          if (nVars != 3) {
            iVar7 = Kit_WordCountOnes(*pTruth & 0xff00ff);
            pStore[3] = iVar7;
            if (nVars == 5) {
              iVar7 = Kit_WordCountOnes((uint)(ushort)*pTruth);
              pStore[4] = iVar7;
            }
          }
        }
      }
    }
  }
  else {
    uVar6 = (ulong)uVar5;
    if (1 << bVar1 < 1) {
      uVar6 = uVar4;
    }
    for (; uVar4 != uVar6; uVar4 = uVar4 + 1) {
      iVar2 = Kit_WordCountOnes(pTruth[uVar4]);
      for (lVar3 = 0; (ulong)(uint)nVars - 5 != lVar3; lVar3 = lVar3 + 1) {
        if (((uint)uVar4 >> ((uint)lVar3 & 0x1f) & 1) == 0) {
          pStore[lVar3 + 5] = pStore[lVar3 + 5] + iVar2;
        }
      }
    }
    lVar3 = 0;
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    if (nVars < 6) {
      iVar7 = 0;
    }
    for (; iVar7 != (int)lVar3; lVar3 = lVar3 + 1) {
      iVar2 = Kit_WordCountOnes((pTruth[lVar3 * 2] & 0x55555555) +
                                (pTruth[lVar3 * 2 + 1] & 0xd5555555) * 2);
      *pStore = *pStore + iVar2;
      iVar2 = Kit_WordCountOnes((pTruth[lVar3 * 2] & 0x33333333) +
                                (pTruth[lVar3 * 2 + 1] & 0xf3333333) * 4);
      pStore[1] = pStore[1] + iVar2;
      iVar2 = Kit_WordCountOnes((pTruth[lVar3 * 2 + 1] & 0xf0f0f0f) << 4 |
                                pTruth[lVar3 * 2] & 0xf0f0f0f);
      pStore[2] = pStore[2] + iVar2;
      iVar2 = Kit_WordCountOnes((pTruth[lVar3 * 2 + 1] & 0xff00ff) << 8 |
                                pTruth[lVar3 * 2] & 0xff00ff);
      pStore[3] = pStore[3] + iVar2;
      iVar2 = Kit_WordCountOnes(pTruth[lVar3 * 2 + 1] << 0x10 | (uint)(ushort)pTruth[lVar3 * 2]);
      pStore[4] = pStore[4] + iVar2;
    }
  }
  return;
}

Assistant:

void Kit_TruthCountOnesInCofs0( unsigned * pTruth, int nVars, int * pStore )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Counter;
    memset( pStore, 0, sizeof(int) * nVars );
    if ( nVars <= 5 )
    {
        if ( nVars > 0 )
            pStore[0] = Kit_WordCountOnes( pTruth[0] & 0x55555555 );
        if ( nVars > 1 )
            pStore[1] = Kit_WordCountOnes( pTruth[0] & 0x33333333 );
        if ( nVars > 2 )
            pStore[2] = Kit_WordCountOnes( pTruth[0] & 0x0F0F0F0F );
        if ( nVars > 3 )
            pStore[3] = Kit_WordCountOnes( pTruth[0] & 0x00FF00FF );
        if ( nVars > 4 )
            pStore[4] = Kit_WordCountOnes( pTruth[0] & 0x0000FFFF );
        return;
    }
    // nVars >= 6
    // count 1's for all other variables
    for ( k = 0; k < nWords; k++ )
    {
        Counter = Kit_WordCountOnes( pTruth[k] );
        for ( i = 5; i < nVars; i++ )
            if ( (k & (1 << (i-5))) == 0 )
                pStore[i] += Counter;
    }
    // count 1's for the first five variables
    for ( k = 0; k < nWords/2; k++ )
    {
        pStore[0] += Kit_WordCountOnes( (pTruth[0] & 0x55555555) | ((pTruth[1] & 0x55555555) <<  1) );
        pStore[1] += Kit_WordCountOnes( (pTruth[0] & 0x33333333) | ((pTruth[1] & 0x33333333) <<  2) );
        pStore[2] += Kit_WordCountOnes( (pTruth[0] & 0x0F0F0F0F) | ((pTruth[1] & 0x0F0F0F0F) <<  4) );
        pStore[3] += Kit_WordCountOnes( (pTruth[0] & 0x00FF00FF) | ((pTruth[1] & 0x00FF00FF) <<  8) );
        pStore[4] += Kit_WordCountOnes( (pTruth[0] & 0x0000FFFF) | ((pTruth[1] & 0x0000FFFF) << 16) );
        pTruth += 2;
    }
}